

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetSceneMarkerDecodedStringMSFT
                   (XrSceneMSFT scene,XrUuidMSFT *markerId,uint32_t bufferCapacityInput,
                   uint32_t *bufferCountOutput,char *buffer)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_461;
  string local_460 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_440;
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3b0;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_320;
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  GenValidUsageXrInstanceInfo *local_2b8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_scenemsft_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_290 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  XrSceneMSFT_T local_208 [32];
  ostringstream local_1e8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_5c;
  undefined1 local_58 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  char *buffer_local;
  uint32_t *bufferCountOutput_local;
  uint32_t bufferCapacityInput_local;
  XrUuidMSFT *markerId_local;
  XrSceneMSFT scene_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  markerId_local = (XrUuidMSFT *)scene;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  local_5c = XR_OBJECT_TYPE_SCENE_MSFT;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSceneMSFT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_58
             ,(XrSceneMSFT_T **)&markerId_local,&local_5c);
  VVar2 = VerifyXrSceneMSFTHandle((XrSceneMSFT *)&markerId_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSceneMSFT_T_*>::getWithInstanceInfo
                      (&g_scenemsft_info,(XrSceneMSFT_T *)markerId_local);
    pVar3.second = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2b8 = pVar3.second;
    gen_scenemsft_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar3.second;
    if (markerId == (XrUuidMSFT *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d8,"VUID-xrGetSceneMarkerDecodedStringMSFT-markerId-parameter",&local_2d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"xrGetSceneMarkerDecodedStringMSFT",&local_301);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_320,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_340,
                 "Invalid NULL for XrUuidMSFT \"markerId\" which is not optional and must be non-NULL"
                 ,&local_341);
      CoreValidLogMessage(pVar3.second,(string *)local_2d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_300,&local_320,(string *)local_340);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_320);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_scenemsft_info;
      pVar3.second = local_2b8;
      pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      scene_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else if ((bufferCapacityInput == 0) || (buffer != (char *)0x0)) {
      if (bufferCountOutput == (uint32_t *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3f8,"VUID-xrGetSceneMarkerDecodedStringMSFT-bufferCountOutput-parameter",
                   &local_3f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_420,"xrGetSceneMarkerDecodedStringMSFT",&local_421);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_440,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_460,
                   "Invalid NULL for uint32_t \"bufferCountOutput\" which is not optional and must be non-NULL"
                   ,&local_461);
        CoreValidLogMessage(pVar3.second,(string *)local_3f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_420,&local_440,(string *)local_460);
        std::__cxx11::string::~string(local_460);
        std::allocator<char>::~allocator((allocator<char> *)&local_461);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_440);
        std::__cxx11::string::~string(local_420);
        std::allocator<char>::~allocator((allocator<char> *)&local_421);
        std::__cxx11::string::~string(local_3f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_scenemsft_info;
        pVar3.second = local_2b8;
        pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        scene_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        scene_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
        pVar1 = pVar3;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_368,"VUID-xrGetSceneMarkerDecodedStringMSFT-buffer-parameter",&local_369);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"xrGetSceneMarkerDecodedStringMSFT",&local_391);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3b0,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3d0,
                 "Command xrGetSceneMarkerDecodedStringMSFT param buffer is NULL, but bufferCapacityInput is greater than 0"
                 ,&local_3d1);
      CoreValidLogMessage(pVar3.second,(string *)local_368,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_390,&local_3b0,(string *)local_3d0);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3b0);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_scenemsft_info;
      pVar3.second = local_2b8;
      pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      scene_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    std::operator<<((ostream *)local_1e8,"Invalid XrSceneMSFT handle \"scene\" ");
    HandleToHexString<XrSceneMSFT_T*>(local_208);
    std::operator<<((ostream *)local_1e8,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_228,"VUID-xrGetSceneMarkerDecodedStringMSFT-scene-parameter",&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"xrGetSceneMarkerDecodedStringMSFT",&local_251);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_270,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_58);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_228,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_250,&local_270,local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_270);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    scene_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
    pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
    pVar1.first = gen_scenemsft_info;
    pVar3.second = local_2b8;
    pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
  }
  info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
  gen_scenemsft_info = pVar1.first;
  local_2b8 = pVar3.second;
  gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  return scene_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetSceneMarkerDecodedStringMSFT(
XrSceneMSFT scene,
const XrUuidMSFT* markerId,
uint32_t bufferCapacityInput,
uint32_t* bufferCountOutput,
char* buffer) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(scene, XR_OBJECT_TYPE_SCENE_MSFT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSceneMSFTHandle(&scene);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSceneMSFT handle \"scene\" ";
                oss << HandleToHexString(scene);
                CoreValidLogMessage(nullptr, "VUID-xrGetSceneMarkerDecodedStringMSFT-scene-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMarkerDecodedStringMSFT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_scenemsft_info.getWithInstanceInfo(scene);
        GenValidUsageXrHandleInfo *gen_scenemsft_info = info_with_instance.first;
        (void)gen_scenemsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == markerId) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSceneMarkerDecodedStringMSFT-markerId-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMarkerDecodedStringMSFT", objects_info,
                                "Invalid NULL for XrUuidMSFT \"markerId\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrGetSceneMarkerDecodedStringMSFT-markerId-parameter" type
        // Optional array must be non-NULL when bufferCapacityInput is non-zero
        if (0 != bufferCapacityInput && nullptr == buffer) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSceneMarkerDecodedStringMSFT-buffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMarkerDecodedStringMSFT",
                                objects_info,
                                "Command xrGetSceneMarkerDecodedStringMSFT param buffer is NULL, but bufferCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == bufferCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSceneMarkerDecodedStringMSFT-bufferCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMarkerDecodedStringMSFT", objects_info,
                                "Invalid NULL for uint32_t \"bufferCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrGetSceneMarkerDecodedStringMSFT-bufferCountOutput-parameter" type
        // NOTE: Can't validate "VUID-xrGetSceneMarkerDecodedStringMSFT-buffer-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}